

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ClearNoResize_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertHelper *this_01;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  int i;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  size_type last_bucket_count;
  int last_element;
  size_type empty_bucket_count;
  bool *in_stack_fffffffffffffe58;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe60;
  unsigned_long *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe80;
  Type in_stack_fffffffffffffe8c;
  AssertHelper *in_stack_fffffffffffffe90;
  AssertionResult local_168 [2];
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  AssertionResult *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  int local_fc;
  string local_f8 [55];
  undefined1 local_c1;
  AssertionResult local_c0 [3];
  size_type local_90;
  AssertionResult local_88;
  size_type local_78;
  value_type *in_stack_ffffffffffffff98;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffffa0;
  int local_14;
  
  bVar1 = google::
          HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_clear_no_resize
                    ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    sVar2 = google::
            BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xb9ba5c);
    local_14 = 1;
    while (sVar3 = google::
                   BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                   *)0xb9ba7d), sVar3 == sVar2) {
      in_stack_fffffffffffffe70 = in_RDI + 0x10;
      HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject(in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_14 = local_14 + 1;
    }
    local_78 = google::
               BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xb9bae6);
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::clear_no_resize((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)0xb9bafc);
    local_90 = google::
               BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)0xb9bb0a);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_RDI,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (unsigned_long *)in_stack_fffffffffffffe60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe68 =
           (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0xb9bb71);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
                 (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffe70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
      testing::Message::~Message((Message *)0xb9bbce);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xb9bc3c);
    local_c1 = google::
               BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::empty((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0xb9bc4a);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (type *)0xb9bc6c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 in_stack_fffffffffffffec0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
                 (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffe70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
      std::__cxx11::string::~string(local_f8);
      testing::Message::~Message((Message *)0xb9bd3f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xb9bdd6);
    for (local_fc = 1; local_fc < local_14; local_fc = local_fc + 1) {
      this_00 = (HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)(in_RDI + 0x10);
      HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject(this_00,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      this_01 = (AssertHelper *)
                google::
                BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xb9be45);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                (in_RDI,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,(unsigned_long *)this_00
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
      if (!bVar1) {
        testing::Message::Message((Message *)this_01);
        in_stack_fffffffffffffe58 =
             (bool *)testing::AssertionResult::failure_message((AssertionResult *)0xb9beac);
        testing::internal::AssertHelper::AssertHelper
                  (this_01,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80,
                   (int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffe70);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        testing::Message::~Message((Message *)0xb9bef8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xb9bf5a);
    }
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ClearNoResize) {
  if (!this->ht_.supports_clear_no_resize()) return;
  typename TypeParam::size_type empty_bucket_count = this->ht_.bucket_count();
  int last_element = 1;
  while (this->ht_.bucket_count() == empty_bucket_count) {
    this->ht_.insert(this->UniqueObject(last_element));
    ++last_element;
  }
  typename TypeParam::size_type last_bucket_count = this->ht_.bucket_count();
  this->ht_.clear_no_resize();
  EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  EXPECT_TRUE(this->ht_.empty());

  // When inserting the same number of elements again, no resize
  // should be necessary.
  for (int i = 1; i < last_element; ++i) {
    this->ht_.insert(this->UniqueObject(last_element + i));
    EXPECT_EQ(last_bucket_count, this->ht_.bucket_count());
  }
}